

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

RegistryHub ** Catch::anon_unknown_23::getTheRegistryHub(void)

{
  RegistryHub *this;
  
  if (getTheRegistryHub::theRegistryHub == (RegistryHub *)0x0) {
    this = (RegistryHub *)operator_new(0xd0);
    RegistryHub::RegistryHub(this);
    getTheRegistryHub::theRegistryHub = this;
  }
  return &getTheRegistryHub::theRegistryHub;
}

Assistant:

inline RegistryHub*& getTheRegistryHub() {
            static RegistryHub* theRegistryHub = CATCH_NULL;
            if( !theRegistryHub )
                theRegistryHub = new RegistryHub();
            return theRegistryHub;
        }